

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<double> *bVal)

{
  ChStreamOutAscii *this_00;
  
  indent(this);
  if (this->suppress_names == false) {
    this_00 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,bVal->_name);
    chrono::ChStreamOutAscii::operator<<(this_00,"\t");
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,*bVal->_value);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<double> bVal) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }